

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O1

ostream * libDAI::operator<<(ostream *os,FactorGraph *fg)

{
  double dVar1;
  undefined1 auVar2 [16];
  char cVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  size_t sVar6;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char buf [20];
  char local_48 [24];
  
  (*(fg->super_GraphicalModel)._vptr_GraphicalModel[9])(fg);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[9])(fg);
  if (CONCAT44(extraout_var,iVar4) != 0) {
    uVar9 = 0;
    do {
      cVar3 = (char)os;
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9);
      for (lVar7 = *(long *)CONCAT44(extraout_var_00,iVar4);
          iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9),
          lVar7 != *(long *)(CONCAT44(extraout_var_01,iVar4) + 8); lVar7 = lVar7 + 0x10) {
        poVar5 = std::ostream::_M_insert<long>((long)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9);
      for (lVar7 = *(long *)CONCAT44(extraout_var_02,iVar4);
          iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9),
          lVar7 != *(long *)(CONCAT44(extraout_var_03,iVar4) + 8); lVar7 = lVar7 + 0x10) {
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9);
      if (*(long *)(CONCAT44(extraout_var_04,iVar4) + 0x28) !=
          *(long *)(CONCAT44(extraout_var_04,iVar4) + 0x20)) {
        uVar8 = 0;
        do {
          iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(*(long *)(CONCAT44(extraout_var_05,iVar4) + 0x20) + uVar8 * 8);
          vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar2,4);
          uVar8 = uVar8 + 1;
          iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(0,fg,uVar9);
        } while (uVar8 < (ulong)(*(long *)(CONCAT44(extraout_var_06,iVar4) + 0x28) -
                                 *(long *)(CONCAT44(extraout_var_06,iVar4) + 0x20) >> 3));
      }
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9);
      if (*(long *)(CONCAT44(extraout_var_07,iVar4) + 0x28) !=
          *(long *)(CONCAT44(extraout_var_07,iVar4) + 0x20)) {
        uVar8 = 0;
        do {
          iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9);
          dVar1 = *(double *)(*(long *)(CONCAT44(extraout_var_08,iVar4) + 0x20) + uVar8 * 8);
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9);
            sprintf(local_48,"%18.14g",
                    *(undefined8 *)(*(long *)(CONCAT44(extraout_var_09,iVar4) + 0x20) + uVar8 * 8));
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)os);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            sVar6 = strlen(local_48);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_48,sVar6);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
          uVar8 = uVar8 + 1;
          iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar9);
        } while (uVar8 < (ulong)(*(long *)(CONCAT44(extraout_var_10,iVar4) + 0x28) -
                                 *(long *)(CONCAT44(extraout_var_10,iVar4) + 0x20) >> 3));
      }
      uVar9 = uVar9 + 1;
      iVar4 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[9])(fg);
    } while (uVar9 < CONCAT44(extraout_var_11,iVar4));
  }
  return os;
}

Assistant:

std::ostream& operator << (std::ostream& os, const FactorGraph& fg) {
        os << fg.nrFactors() << endl;

        for( size_t I = 0; I < fg.nrFactors(); I++ ) {
            os << endl;
            os << fg.factor(I).vars().size() << endl;
            for( VarSet::const_iterator i = fg.factor(I).vars().begin(); i != fg.factor(I).vars().end(); i++ )
                os << i->label() << " ";
            os << endl;
            for( VarSet::const_iterator i = fg.factor(I).vars().begin(); i != fg.factor(I).vars().end(); i++ )
                os << i->states() << " ";
            os << endl;
            size_t nr_nonzeros = 0;
            for( size_t k = 0; k < fg.factor(I).stateSpace(); k++ )
                if( fg.factor(I)[k] != 0.0 )
                    nr_nonzeros++;
            os << nr_nonzeros << endl;
            for( size_t k = 0; k < fg.factor(I).stateSpace(); k++ )
                if( fg.factor(I)[k] != 0.0 ) {
                    char buf[20];
                    sprintf(buf,"%18.14g", fg.factor(I)[k]);
                    os << k << " " << buf << endl;
                }
        }

        return(os);
    }